

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void do_paint(Terminal *term)

{
  _Bool _Var1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  unsigned_long bchr;
  wchar_t wVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  _Bool _Var8;
  wchar_t wVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  wchar_t *ch;
  void *ptr;
  termline *ptVar13;
  termchar *ptVar14;
  uint uVar15;
  termchar *ptVar16;
  wchar_t scr_y;
  termline **pptVar17;
  termline *ptVar18;
  long lVar19;
  wchar_t wVar20;
  uint uVar21;
  long lVar22;
  termchar *ptVar23;
  byte bVar24;
  ulong uVar25;
  wchar_t *pwVar26;
  int iVar27;
  unsigned_long *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  wchar_t wVar33;
  ulong uVar34;
  unsigned_long *puVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  optionalrgb oVar39;
  optionalrgb oVar40;
  byte local_fc;
  byte local_fb;
  byte local_fa;
  _Bool local_f9;
  byte local_f8;
  byte local_f7;
  byte local_f6;
  _Bool local_f5;
  wchar_t local_d0;
  ulong local_b8;
  size_t chlen;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  chlen = 0x400;
  ch = (wchar_t *)safemalloc(0x400,4,0);
  ptr = safemalloc((long)term->cols,0x20,0);
  wVar4 = L'\0';
  if (term->cursor_on == true) {
    wVar9 = L'\x20000000';
    if ((term->has_focus == true) && (wVar9 = L'\x40000000', term->cblinker == false)) {
      wVar9 = (term->blink_cur ^ 1) << 0x1e;
    }
    wVar4 = wVar9 | 0x10000000;
    if (term->wrapnext == false) {
      wVar4 = wVar9;
    }
  }
  _Var8 = term->rvideo;
  _Var1 = term->in_vbell;
  wVar9 = (term->curs).y;
  uVar31 = (long)wVar9 - (long)term->disptop;
  ptVar13 = lineptr(term,wVar9,L'ᝀ',L'\0');
  wVar9 = (term->curs).x;
  scr_y = (wchar_t)uVar31;
  ptVar14 = term_bidi_line(term,ptVar13,scr_y);
  if (ptVar14 == (termchar *)0x0) {
    ptVar14 = ptVar13->chars;
  }
  else {
    wVar9 = term->post_bidi_cache[uVar31].forward[wVar9];
  }
  if (L'\0' < wVar9) {
    wVar9 = wVar9 - (uint)(ptVar14[(uint)wVar9].chr == 0xdfff);
  }
  if (ptVar13->temporary == true) {
    safefree(ptVar13->chars);
    safefree(ptVar13);
  }
  wVar20 = term->dispcursy;
  if ((-1 < (long)wVar20) &&
     (((wVar33 = term->dispcursx, term->curstype != wVar4 || (wVar20 != scr_y)) || (wVar33 != wVar9)
      ))) {
    ptVar14 = term->disptext[wVar20]->chars + wVar33;
    if ((L'\0' < wVar33) && (ptVar14->chr == 0xdfff)) {
      *(uint *)&ptVar14[-1].attr = (uint)ptVar14[-1].attr | 0x3ffff;
    }
    if ((wVar33 < term->cols + L'\xffffffff') && (ptVar14[1].chr == 0xdfff)) {
      *(uint *)&ptVar14[1].attr = (uint)ptVar14[1].attr | 0x3ffff;
    }
    *(uint *)&ptVar14->attr = (uint)ptVar14->attr | 0x3ffff;
    term->curstype = L'\0';
  }
  term->dispcursx = L'\xffffffff';
  term->dispcursy = L'\xffffffff';
  if (L'\0' < term->rows) {
    local_38 = (ulong)(_Var8 != _Var1) << 0x14;
    local_48 = (ulong)(uint)wVar4;
    local_40 = (ulong)(uint)wVar9 << 2;
    uVar36 = 0;
    do {
      wVar33 = (wchar_t)uVar36;
      wVar20 = term->disptop + wVar33;
      ptVar13 = lineptr(term,wVar20,L'᝶',L'\0');
      ptVar14 = term_bidi_line(term,ptVar13,wVar33);
      if (ptVar14 == (termchar *)0x0) {
        ptVar14 = ptVar13->chars;
        pwVar26 = (wchar_t *)0x0;
      }
      else {
        pwVar26 = term->post_bidi_cache[uVar36].backward;
      }
      uVar29 = (ulong)(uint)term->cols;
      if (term->cols < L'\x01') {
        pptVar17 = term->disptext;
LAB_001073a9:
        ptVar18 = pptVar17[uVar36];
        bVar37 = false;
      }
      else {
        lVar32 = 0;
        lVar19 = 0;
        do {
          if (pwVar26 == (wchar_t *)0x0) {
            wVar12 = (wchar_t)lVar19;
          }
          else {
            wVar12 = *(wchar_t *)((long)pwVar26 + lVar32);
          }
          uVar25 = (ulong)((uint)(&ptVar14->attr)[lVar32] & 0xfffc0000) | 0x20500;
          if (term->ansi_colour != false) {
            uVar25 = (&ptVar14->attr)[lVar32];
          }
          if (term->xterm_256_colour == false) {
            uVar34 = (ulong)((uint)uVar25 & 0xfffffe00) | 0x100;
            if (0xef < ((uint)uVar25 & 0x1f0) - 0x10) {
              uVar34 = uVar25;
            }
            uVar25 = (ulong)((uint)uVar34 & 0xfffc01ff) | 0x20400;
            if (0xef < ((uint)(uVar34 >> 9) & 0x1f0) - 0x10) {
              uVar25 = uVar34;
            }
          }
          oVar39.enabled = false;
          oVar39.r = '\0';
          oVar39.g = '\0';
          oVar39.b = '\0';
          oVar40.enabled = false;
          oVar40.r = '\0';
          oVar40.g = '\0';
          oVar40.b = '\0';
          if (term->true_colour == true) {
            oVar39 = (&ptVar14->truecolour)[lVar32].fg;
            oVar40 = (&ptVar14->truecolour)[lVar32].bg;
          }
          uVar34 = (&ptVar14->chr)[lVar32];
          uVar21 = (uint)uVar34 & 0xffffff00;
          if (uVar21 == 0xd800) {
            lVar22 = 0x40c;
LAB_001070c7:
            uVar34 = (ulong)*(int *)((long)term->ucsdata->unitab_scoacs +
                                    (uVar34 & 0xff) * 4 + lVar22 + -0xc);
          }
          else {
            if (uVar21 == 0xda00) {
              lVar22 = 0xc;
              goto LAB_001070c7;
            }
            if (uVar21 == 0xd900) {
              lVar22 = 0xc0c;
              goto LAB_001070c7;
            }
          }
          if ((lVar19 < (int)uVar29 + -1) && ((&ptVar14[1].chr)[lVar32] == 0xdfff)) {
            uVar25 = uVar25 | 0x400000;
          }
          if ((term->selstate & ~ABOUT_TO) == DRAGGING) {
            wVar10 = (term->selstart).y;
            wVar11 = (term->selstart).x;
            if (term->seltype == LEXICOGRAPHIC) {
              bVar37 = wVar11 <= wVar12;
              if (wVar20 != wVar10) {
                bVar37 = wVar10 < wVar20;
              }
              if (bVar37) {
                wVar11 = (term->selend).y;
                bVar37 = wVar12 < (term->selend).x;
                if (wVar20 != wVar11) {
                  bVar37 = wVar20 < wVar11;
                }
                if (bVar37) {
LAB_00107193:
                  uVar29 = 0x100000;
                  goto LAB_0010719e;
                }
              }
              goto LAB_0010719b;
            }
            if (wVar20 < wVar10) goto LAB_0010719b;
            uVar29 = 0;
            if (wVar11 <= wVar12) {
              if (wVar12 < (term->selend).x && wVar20 <= (term->selend).y) goto LAB_00107193;
              goto LAB_0010719b;
            }
          }
          else {
LAB_0010719b:
            uVar29 = 0;
          }
LAB_0010719e:
          uVar29 = uVar29 ^ local_38 ^ uVar25;
          if ((term->blink_is_real == true) && ((uVar25 & 0x200000) != 0)) {
            if ((term->has_focus == true) && (term->tblinker == true)) {
              uVar34 = (ulong)term->ucsdata->unitab_line[0x20];
            }
            uVar29 = (ulong)((uint)uVar29 & 0xffdfffff);
          }
          ptVar23 = term->disptext[uVar36]->chars;
          if ((uVar34 == (&ptVar23->chr)[lVar32]) &&
             (uVar25 = (&ptVar23->attr)[lVar32], uVar29 == (uVar25 & 0xffffffff0f7fffff))) {
            uVar29 = uVar29 | (uint)uVar25 & 0x800000;
          }
          else if (((uint)uVar29 >> 0x16 & 1) == 0) {
            wVar12 = (*term->win->vt->char_width)(term->win,(wchar_t)uVar34);
            if (wVar12 == L'\x02') {
              uVar29 = uVar29 | 0x800000;
            }
          }
          if ((uVar36 == (uVar31 & 0xffffffff)) && (local_40 == lVar32)) {
            uVar29 = uVar29 | local_48;
            term->curstype = wVar4;
            term->dispcursx = wVar9;
            term->dispcursy = scr_y;
          }
          *(ulong *)((long)ptr + lVar32 * 8 + 8) = uVar29;
          *(ulong *)((long)ptr + lVar32 * 8) = uVar34;
          *(ulong *)((long)ptr + lVar32 * 8 + 0x10) = CONCAT44(oVar40,oVar39);
          *(undefined4 *)((long)ptr + lVar32 * 8 + 0x18) = 0;
          lVar19 = lVar19 + 1;
          wVar12 = term->cols;
          uVar29 = (ulong)wVar12;
          lVar32 = lVar32 + 4;
        } while (lVar19 < (long)uVar29);
        pptVar17 = term->disptext;
        bVar37 = L'\0' < wVar12;
        if (wVar12 < L'\x01') goto LAB_001073a9;
        ptVar18 = pptVar17[uVar36];
        ptVar23 = ptVar18->chars;
        uVar25 = 0;
        bVar5 = false;
        iVar27 = 0;
        do {
          ptVar16 = ptVar23 + uVar25;
          puVar28 = &ptVar16->attr;
          uVar34 = *puVar28;
          if ((int)uVar34 < 0) {
            bVar5 = false;
            iVar27 = (int)uVar25;
          }
          if ((ptVar16->chr == *(unsigned_long *)((long)ptr + uVar25 * 0x20)) &&
             ((uVar34 & 0xffffffff0fffffff) == *(ulong *)((long)ptr + uVar25 * 0x20 + 8))) {
            if (bVar5) goto LAB_00107383;
          }
          else {
            if (!bVar5) {
              uVar30 = (ulong)iVar27;
              bVar5 = true;
              if ((long)uVar30 < (long)uVar25) {
                puVar35 = &ptVar23[uVar30].attr;
                do {
                  *(uint *)puVar35 = (uint)*puVar35 | 0x3ffff;
                  uVar30 = uVar30 + 1;
                  puVar35 = puVar35 + 4;
                } while (uVar25 != uVar30);
                uVar34 = *puVar28;
              }
            }
LAB_00107383:
            *puVar28 = uVar34 | 0x3ffff;
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar29);
      }
      uVar2 = ptVar13->lattr;
      uVar3 = ptVar18->lattr;
      ptVar18->lattr = uVar2;
      if (bVar37) {
        local_fc = (term->erase_char).truecolour.bg.b;
        local_fb = (term->erase_char).truecolour.bg.g;
        local_fa = (term->erase_char).truecolour.bg.r;
        local_f9 = (term->erase_char).truecolour.bg.enabled;
        local_f8 = (term->erase_char).truecolour.fg.b;
        local_f7 = (term->erase_char).truecolour.fg.g;
        local_f5 = (term->erase_char).truecolour.fg.enabled;
        local_f6 = (term->erase_char).truecolour.fg.r;
        bVar37 = uVar2 != uVar3;
        wVar20 = L'\0';
        bVar5 = false;
        uVar29 = 0;
        local_d0 = L'\0';
        uVar21 = 0;
        local_b8 = 0;
        bVar6 = bVar37;
        do {
          wVar12 = (wchar_t)uVar29;
          lVar19 = (long)wVar20;
          lVar32 = lVar19 * 0x20;
          uVar25 = *(ulong *)((long)ptr + lVar32 + 8);
          ptVar23 = term->disptext[uVar36]->chars;
          if ((((uint)ptVar23[lVar19].attr ^ (uint)uVar25) >> 0x16 & 1) != 0) {
            bVar6 = true;
          }
          bVar38 = ((uVar25 ^ local_b8) & (long)term->attr_mask) != 0;
          bVar7 = *(byte *)((long)ptr + lVar32 + 0x10);
          if ((((((bVar7 != (local_f5 & 1U)) || (*(byte *)((long)ptr + lVar32 + 0x11) != local_f6))
                || (*(byte *)((long)ptr + lVar32 + 0x12) != local_f7)) ||
               ((*(byte *)((long)ptr + lVar32 + 0x13) != local_f8 ||
                (*(byte *)((long)ptr + lVar32 + 0x14) != (local_f9 & 1U))))) ||
              (*(byte *)((long)ptr + lVar32 + 0x15) != local_fa)) ||
             ((*(byte *)((long)ptr + lVar32 + 0x16) != local_fb ||
              (*(byte *)((long)ptr + lVar32 + 0x17) != local_fc)))) {
            bVar38 = true;
          }
          bchr = *(unsigned_long *)((long)ptr + lVar32);
          wVar11 = (wchar_t)bchr;
          uVar15 = 0;
          if ((wVar11 & 0xfffffe00U) == 0xdc00) {
            uVar15 = wVar11 & 0xffffff00U;
          }
          ptVar16 = ptVar14 + lVar19;
          if ((wVar11 & 0xfffffc00U) == 0xd800) {
            uVar15 = wVar11 & 0xffffff00U;
          }
          if ((ptVar16->cc_next != L'\0') ||
             ((bVar38 = (bool)(uVar15 != uVar21 | bVar38), L'\0' < wVar20 &&
              (ptVar16[-1].cc_next != L'\0')))) {
            bVar38 = true;
          }
          if ((ptVar16->chr == 0xdffe) ||
             (((L'\x01' < wVar20 && (ptVar16[-1].chr == 0xdfff)) && (ptVar16[-2].chr == 0xdffe)))) {
            bVar38 = true;
          }
          bVar24 = term->ucsdata->dbcs_screenfont;
          if (((_Bool)bVar24 != false) || (bVar6)) {
            if (bVar38) goto LAB_00107682;
          }
          else if (((((((ptVar23[lVar19].chr == bchr) &&
                       ((ptVar23[lVar19].attr & 0xffffffff0fffffff) == uVar25)) &&
                      ((ptVar23[lVar19].truecolour.fg.enabled == (_Bool)(local_f5 & 1U) &&
                       (((ptVar23[lVar19].truecolour.fg.r == local_f6 &&
                         (ptVar23[lVar19].truecolour.fg.g == local_f7)) &&
                        (ptVar23[lVar19].truecolour.fg.b == local_f8)))))) &&
                     ((ptVar23[lVar19].truecolour.bg.enabled == (_Bool)(local_f9 & 1U) &&
                      (ptVar23[lVar19].truecolour.bg.r == local_fa)))) &&
                    (ptVar23[lVar19].truecolour.bg.g == local_fb)) &&
                   (ptVar23[lVar19].truecolour.bg.b == local_fc)) ||
                  ((bool)(~bVar37 & wVar12 == L'\x01') || bVar38)) {
LAB_00107682:
            if (((bVar37) || (bVar5)) && (L'\0' < wVar12)) {
              do_paint_draw(term,ptVar13,local_d0,wVar33,ch,wVar12,local_b8,
                            (truecolour)
                            ((ulong)((uint)local_f9 |
                                    (uint)local_fa << 8 |
                                    (uint)local_fb << 0x10 | (uint)local_fc << 0x18) << 0x20 |
                            (ulong)local_f5 |
                            (ulong)((uint)local_f6 << 8 |
                                   (uint)local_f7 << 0x10 | (uint)local_f8 << 0x18)));
              bVar7 = *(byte *)((long)ptr + lVar32 + 0x10);
              bVar24 = term->ucsdata->dbcs_screenfont;
              ptVar23 = term->disptext[uVar36]->chars;
            }
            local_f6 = *(byte *)((long)ptr + lVar32 + 0x11);
            local_f7 = *(byte *)((long)ptr + lVar32 + 0x12);
            local_f8 = *(byte *)((long)ptr + lVar32 + 0x13);
            local_f9 = *(_Bool *)((long)ptr + lVar32 + 0x14);
            local_fa = *(byte *)((long)ptr + lVar32 + 0x15);
            local_fb = *(byte *)((long)ptr + lVar32 + 0x16);
            local_fc = *(byte *)((long)ptr + lVar32 + 0x17);
            if ((bVar24 & 1) != 0) {
              bVar5 = bVar37;
            }
            wVar12 = L'\0';
            local_f5 = (_Bool)bVar7;
            local_d0 = wVar20;
            local_b8 = uVar25;
            bVar37 = bVar6;
            uVar21 = uVar15;
          }
          _Var8 = termchars_equal_override(ptVar23 + lVar19,ptVar16,bchr,uVar25);
          if (!_Var8) {
            bVar37 = true;
          }
          ch = (wchar_t *)safegrowarray(ch,&chlen,4,(long)wVar12,2,false);
          uVar29 = (ulong)(uint)(wVar12 + L'\x01');
          ch[wVar12] = wVar11;
          wVar11 = ptVar16->cc_next;
          if (wVar11 != L'\0') {
            uVar29 = (ulong)(wVar12 + L'\x01');
            ptVar23 = ptVar16;
            do {
              wVar12 = (wchar_t)ptVar23[wVar11].chr;
              uVar15 = wVar12 & 0xffffff00;
              if (uVar15 == 0xd800) {
                lVar32 = 0x40c;
LAB_00107889:
                wVar12 = *(wchar_t *)
                          ((long)term->ucsdata->unitab_scoacs +
                          (ptVar23[wVar11].chr & 0xff) * 4 + lVar32 + -0xc);
              }
              else {
                if (uVar15 == 0xda00) {
                  lVar32 = 0xc;
                  goto LAB_00107889;
                }
                if (uVar15 == 0xd900) {
                  lVar32 = 0xc0c;
                  goto LAB_00107889;
                }
              }
              ptVar23 = ptVar23 + wVar11;
              ch = (wchar_t *)safegrowarray(ch,&chlen,4,uVar29,2,false);
              ch[uVar29] = wVar12;
              uVar29 = uVar29 + 1;
              wVar11 = ptVar23->cc_next;
            } while (wVar11 != L'\0');
            local_b8 = local_b8 | 0x80000000;
          }
          if (!_Var8) {
            copy_termchar(term->disptext[uVar36],wVar20,ptVar16);
            ptVar23 = term->disptext[uVar36]->chars;
            ptVar23[lVar19].chr = bchr;
            ptVar23[lVar19].attr = uVar25;
            ptVar23[lVar19].truecolour.fg.enabled = local_f5;
            ptVar23[lVar19].truecolour.fg.r = local_f6;
            ptVar23[lVar19].truecolour.fg.g = local_f7;
            ptVar23[lVar19].truecolour.fg.b = local_f8;
            ptVar23[lVar19].truecolour.bg.enabled = local_f9;
            ptVar23[lVar19].truecolour.bg.r = local_fa;
            ptVar23[lVar19].truecolour.bg.g = local_fb;
            ptVar23[lVar19].truecolour.bg.b = local_fc;
            if (local_d0 == wVar20) {
              puVar28 = &term->disptext[uVar36]->chars[lVar19].attr;
              *puVar28 = *puVar28 | 0x80000000;
            }
          }
          wVar12 = term->cols;
          if ((((uint)uVar25 >> 0x16 & 1) != 0) && (wVar20 = wVar20 + L'\x01', wVar20 < wVar12)) {
            if ((uVar36 == (uVar31 & 0xffffffff)) && (wVar20 == wVar9)) {
              __assert_fail("!(i == our_curs_y && j == our_curs_x)",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                            ,0x189a,"void do_paint(Terminal *)");
            }
            ptVar18 = term->disptext[uVar36];
            _Var8 = termchars_equal_override
                              (ptVar18->chars + wVar20,ptVar16 + 1,ptVar16[1].chr,ptVar16[1].attr);
            if (!_Var8) {
              bVar37 = true;
            }
            copy_termchar(ptVar18,wVar20,ptVar16 + 1);
            wVar12 = term->cols;
          }
          wVar20 = wVar20 + L'\x01';
        } while (wVar20 < wVar12);
        if ((bVar37) && (L'\0' < (wchar_t)uVar29)) {
          do_paint_draw(term,ptVar13,local_d0,wVar33,ch,(wchar_t)uVar29,local_b8,
                        (truecolour)
                        ((ulong)((uint)local_f9 |
                                (uint)local_fa << 8 |
                                (uint)local_fb << 0x10 | (uint)local_fc << 0x18) << 0x20 |
                        (ulong)local_f5 |
                        (ulong)((uint)local_f6 << 8 |
                               (uint)local_f7 << 0x10 | (uint)local_f8 << 0x18)));
        }
      }
      if (ptVar13->temporary == true) {
        safefree(ptVar13->chars);
        safefree(ptVar13);
      }
      uVar36 = uVar36 + 1;
    } while ((long)uVar36 < (long)term->rows);
  }
  safefree(ptr);
  safefree(ch);
  return;
}

Assistant:

static void do_paint(Terminal *term)
{
    int i, j, our_curs_y, our_curs_x;
    int rv, cursor;
    pos scrpos;
    wchar_t *ch;
    size_t chlen;
    termchar *newline;

    chlen = 1024;
    ch = snewn(chlen, wchar_t);

    newline = snewn(term->cols, termchar);

    rv = (!term->rvideo ^ !term->in_vbell ? ATTR_REVERSE : 0);

    /* Depends on:
     * screen array, disptop, scrtop,
     * selection, rv,
     * blinkpc, blink_is_real, tblinker,
     * curs.y, curs.x, cblinker, blink_cur, cursor_on, has_focus, wrapnext
     */

    /* Has the cursor position or type changed ? */
    if (term->cursor_on) {
        if (term->has_focus) {
            if (term->cblinker || !term->blink_cur)
                cursor = TATTR_ACTCURS;
            else
                cursor = 0;
        } else
            cursor = TATTR_PASCURS;
        if (term->wrapnext)
            cursor |= TATTR_RIGHTCURS;
    } else
        cursor = 0;
    our_curs_y = term->curs.y - term->disptop;
    {
        /*
         * Adjust the cursor position:
         *  - for bidi
         *  - in the case where it's resting on the right-hand half
         *    of a CJK wide character. xterm's behaviour here,
         *    which seems adequate to me, is to display the cursor
         *    covering the _whole_ character, exactly as if it were
         *    one space to the left.
         */
        termline *ldata = lineptr(term->curs.y);
        termchar *lchars;

        our_curs_x = term->curs.x;

        if ( (lchars = term_bidi_line(term, ldata, our_curs_y)) != NULL) {
            our_curs_x = term->post_bidi_cache[our_curs_y].forward[our_curs_x];
        } else
            lchars = ldata->chars;

        if (our_curs_x > 0 &&
            lchars[our_curs_x].chr == UCSWIDE)
            our_curs_x--;

        unlineptr(ldata);
    }

    /*
     * If the cursor is not where it was last time we painted, and
     * its previous position is visible on screen, invalidate its
     * previous position.
     */
    if (term->dispcursy >= 0 &&
        (term->curstype != cursor ||
         term->dispcursy != our_curs_y ||
         term->dispcursx != our_curs_x)) {
        termchar *dispcurs = term->disptext[term->dispcursy]->chars +
            term->dispcursx;

        if (term->dispcursx > 0 && dispcurs->chr == UCSWIDE)
            dispcurs[-1].attr |= ATTR_INVALID;
        if (term->dispcursx < term->cols-1 && dispcurs[1].chr == UCSWIDE)
            dispcurs[1].attr |= ATTR_INVALID;
        dispcurs->attr |= ATTR_INVALID;

        term->curstype = 0;
    }
    term->dispcursx = term->dispcursy = -1;

    /* The normal screen data */
    for (i = 0; i < term->rows; i++) {
        termline *ldata;
        termchar *lchars;
        bool dirty_line, dirty_run, selected;
        unsigned long attr = 0, cset = 0;
        int start = 0;
        int ccount = 0;
        bool last_run_dirty = false;
        int laststart;
        bool dirtyrect;
        int *backward;
        truecolour tc;

        scrpos.y = i + term->disptop;
        ldata = lineptr(scrpos.y);

        /* Do Arabic shaping and bidi. */
        lchars = term_bidi_line(term, ldata, i);
        if (lchars) {
            backward = term->post_bidi_cache[i].backward;
        } else {
            lchars = ldata->chars;
            backward = NULL;
        }

        /*
         * First loop: work along the line deciding what we want
         * each character cell to look like.
         */
        for (j = 0; j < term->cols; j++) {
            unsigned long tattr, tchar;
            termchar *d = lchars + j;
            scrpos.x = backward ? backward[j] : j;

            tchar = d->chr;
            tattr = d->attr;

            if (!term->ansi_colour)
                tattr = (tattr & ~(ATTR_FGMASK | ATTR_BGMASK)) |
                ATTR_DEFFG | ATTR_DEFBG;

            if (!term->xterm_256_colour) {
                int colour;
                colour = (tattr & ATTR_FGMASK) >> ATTR_FGSHIFT;
                if (colour >= 16 && colour < 256)
                    tattr = (tattr &~ ATTR_FGMASK) | ATTR_DEFFG;
                colour = (tattr & ATTR_BGMASK) >> ATTR_BGSHIFT;
                if (colour >= 16 && colour < 256)
                    tattr = (tattr &~ ATTR_BGMASK) | ATTR_DEFBG;
            }

            if (term->true_colour) {
                tc = d->truecolour;
            } else {
                tc.fg = tc.bg = optionalrgb_none;
            }

            switch (tchar & CSET_MASK) {
              case CSET_ASCII:
                tchar = term->ucsdata->unitab_line[tchar & 0xFF];
                break;
              case CSET_LINEDRW:
                tchar = term->ucsdata->unitab_xterm[tchar & 0xFF];
                break;
              case CSET_SCOACS:
                tchar = term->ucsdata->unitab_scoacs[tchar&0xFF];
                break;
            }
            if (j < term->cols-1 && d[1].chr == UCSWIDE)
                tattr |= ATTR_WIDE;

            /* Video reversing things */
            if (term->selstate == DRAGGING || term->selstate == SELECTED) {
                if (term->seltype == LEXICOGRAPHIC)
                    selected = (posle(term->selstart, scrpos) &&
                                poslt(scrpos, term->selend));
                else
                    selected = (posPle(term->selstart, scrpos) &&
                                posPle_left(scrpos, term->selend));
            } else
                selected = false;
            tattr = (tattr ^ rv
                     ^ (selected ? ATTR_REVERSE : 0));

            /* 'Real' blinking ? */
            if (term->blink_is_real && (tattr & ATTR_BLINK)) {
                if (term->has_focus && term->tblinker) {
                    tchar = term->ucsdata->unitab_line[(unsigned char)' '];
                }
                tattr &= ~ATTR_BLINK;
            }

            /*
             * Check the font we'll _probably_ be using to see if
             * the character is wide when we don't want it to be.
             */
            if (tchar != term->disptext[i]->chars[j].chr ||
                tattr != (term->disptext[i]->chars[j].attr &~
                          (ATTR_NARROW | DATTR_MASK))) {
                if ((tattr & ATTR_WIDE) == 0 &&
                    win_char_width(term->win, tchar) == 2)
                    tattr |= ATTR_NARROW;
            } else if (term->disptext[i]->chars[j].attr & ATTR_NARROW)
                tattr |= ATTR_NARROW;

            if (i == our_curs_y && j == our_curs_x) {
                tattr |= cursor;
                term->curstype = cursor;
                term->dispcursx = j;
                term->dispcursy = i;
            }

            /* FULL-TERMCHAR */
            newline[j].attr = tattr;
            newline[j].chr = tchar;
            newline[j].truecolour = tc;
            /* Combining characters are still read from lchars */
            newline[j].cc_next = 0;
        }

        /*
         * Now loop over the line again, noting where things have
         * changed.
         *
         * During this loop, we keep track of where we last saw
         * DATTR_STARTRUN. Any mismatch automatically invalidates
         * _all_ of the containing run that was last printed: that
         * is, any rectangle that was drawn in one go in the
         * previous update should be either left completely alone
         * or overwritten in its entirety. This, along with the
         * expectation that front ends clip all text runs to their
         * bounding rectangle, should solve any possible problems
         * with fonts that overflow their character cells.
         */
        laststart = 0;
        dirtyrect = false;
        for (j = 0; j < term->cols; j++) {
            if (term->disptext[i]->chars[j].attr & DATTR_STARTRUN) {
                laststart = j;
                dirtyrect = false;
            }

            if (term->disptext[i]->chars[j].chr != newline[j].chr ||
                (term->disptext[i]->chars[j].attr &~ DATTR_MASK)
                != newline[j].attr) {
                int k;

                if (!dirtyrect) {
                    for (k = laststart; k < j; k++)
                        term->disptext[i]->chars[k].attr |= ATTR_INVALID;

                    dirtyrect = true;
                }
            }

            if (dirtyrect)
                term->disptext[i]->chars[j].attr |= ATTR_INVALID;
        }

        /*
         * Finally, loop once more and actually do the drawing.
         */
        dirty_run = dirty_line = (ldata->lattr !=
                                  term->disptext[i]->lattr);
        term->disptext[i]->lattr = ldata->lattr;

        tc = term->erase_char.truecolour;
        for (j = 0; j < term->cols; j++) {
            unsigned long tattr, tchar;
            bool break_run, do_copy;
            termchar *d = lchars + j;

            tattr = newline[j].attr;
            tchar = newline[j].chr;

            if ((term->disptext[i]->chars[j].attr ^ tattr) & ATTR_WIDE)
                dirty_line = true;

            break_run = ((tattr ^ attr) & term->attr_mask) != 0;

            if (!truecolour_equal(newline[j].truecolour, tc))
                break_run = true;

#ifdef USES_VTLINE_HACK
            /* Special hack for VT100 Linedraw glyphs */
            if ((tchar >= 0x23BA && tchar <= 0x23BD) ||
                (j > 0 && (newline[j-1].chr >= 0x23BA &&
                           newline[j-1].chr <= 0x23BD)))
                break_run = true;
#endif

            /*
             * Separate out sequences of characters that have the
             * same CSET, if that CSET is a magic one.
             */
            if (CSET_OF(tchar) != cset)
                break_run = true;

            /*
             * Break on both sides of any combined-character cell.
             */
            if (d->cc_next != 0 ||
                (j > 0 && d[-1].cc_next != 0))
                break_run = true;

            /*
             * Break on both sides of a trust sigil.
             */
            if (d->chr == TRUST_SIGIL_CHAR ||
                (j >= 2 && d[-1].chr == UCSWIDE &&
                 d[-2].chr == TRUST_SIGIL_CHAR))
                break_run = true;

            if (!term->ucsdata->dbcs_screenfont && !dirty_line) {
                if (term->disptext[i]->chars[j].chr == tchar &&
                    (term->disptext[i]->chars[j].attr &~ DATTR_MASK)==tattr &&
                    truecolour_equal(
                        term->disptext[i]->chars[j].truecolour, tc))
                    break_run = true;
                else if (!dirty_run && ccount == 1)
                    break_run = true;
            }

            if (break_run) {
                if ((dirty_run || last_run_dirty) && ccount > 0)
                    do_paint_draw(term, ldata, start, i, ch, ccount, attr, tc);
                start = j;
                ccount = 0;
                attr = tattr;
                tc = newline[j].truecolour;
                cset = CSET_OF(tchar);
                if (term->ucsdata->dbcs_screenfont)
                    last_run_dirty = dirty_run;
                dirty_run = dirty_line;
            }

            do_copy = false;
            if (!termchars_equal_override(&term->disptext[i]->chars[j],
                                          d, tchar, tattr)) {
                do_copy = true;
                dirty_run = true;
            }

            sgrowarrayn(ch, chlen, ccount, 2);

#ifdef PLATFORM_IS_UTF16
            if (tchar > 0x10000 && tchar < 0x110000) {
                ch[ccount++] = (wchar_t) HIGH_SURROGATE_OF(tchar);
                ch[ccount++] = (wchar_t) LOW_SURROGATE_OF(tchar);
            } else
#endif /* PLATFORM_IS_UTF16 */
            ch[ccount++] = (wchar_t) tchar;

            if (d->cc_next) {
                termchar *dd = d;

                while (dd->cc_next) {
                    unsigned long schar;

                    dd += dd->cc_next;

                    schar = dd->chr;
                    switch (schar & CSET_MASK) {
                      case CSET_ASCII:
                        schar = term->ucsdata->unitab_line[schar & 0xFF];
                        break;
                      case CSET_LINEDRW:
                        schar = term->ucsdata->unitab_xterm[schar & 0xFF];
                        break;
                      case CSET_SCOACS:
                        schar = term->ucsdata->unitab_scoacs[schar&0xFF];
                        break;
                    }

                    sgrowarrayn(ch, chlen, ccount, 2);

#ifdef PLATFORM_IS_UTF16
                    if (schar > 0x10000 && schar < 0x110000) {
                        ch[ccount++] = (wchar_t) HIGH_SURROGATE_OF(schar);
                        ch[ccount++] = (wchar_t) LOW_SURROGATE_OF(schar);
                    } else
#endif /* PLATFORM_IS_UTF16 */
                    ch[ccount++] = (wchar_t) schar;
                }

                attr |= TATTR_COMBINING;
            }

            if (do_copy) {
                copy_termchar(term->disptext[i], j, d);
                term->disptext[i]->chars[j].chr = tchar;
                term->disptext[i]->chars[j].attr = tattr;
                term->disptext[i]->chars[j].truecolour = tc;
                if (start == j)
                    term->disptext[i]->chars[j].attr |= DATTR_STARTRUN;
            }

            /* If it's a wide char step along to the next one. */
            if (tattr & ATTR_WIDE) {
                if (++j < term->cols) {
                    d++;
                    /*
                     * By construction above, the cursor should not
                     * be on the right-hand half of this character.
                     * Ever.
                     */
                    assert(!(i == our_curs_y && j == our_curs_x));
                    if (!termchars_equal(&term->disptext[i]->chars[j], d))
                        dirty_run = true;
                    copy_termchar(term->disptext[i], j, d);
                }
            }
        }
        if (dirty_run && ccount > 0)
            do_paint_draw(term, ldata, start, i, ch, ccount, attr, tc);

        unlineptr(ldata);
    }

    sfree(newline);
    sfree(ch);
}